

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_shmtx.c
# Opt level: O0

ngx_uint_t ngx_shmtx_force_unlock(ngx_shmtx_t *mtx,ngx_pid_t pid)

{
  bool bVar1;
  ngx_pid_t pid_local;
  ngx_shmtx_t *mtx_local;
  
  if ((ngx_cycle->log->log_level & 0x10) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"shmtx forced unlock");
  }
  LOCK();
  bVar1 = (long)pid == *mtx->lock;
  if (bVar1) {
    *mtx->lock = 0;
  }
  UNLOCK();
  if (bVar1) {
    ngx_shmtx_wakeup(mtx);
  }
  mtx_local = (ngx_shmtx_t *)(ulong)bVar1;
  return (ngx_uint_t)mtx_local;
}

Assistant:

ngx_uint_t
ngx_shmtx_force_unlock(ngx_shmtx_t *mtx, ngx_pid_t pid)
{
    ngx_log_debug0(NGX_LOG_DEBUG_CORE, ngx_cycle->log, 0,
                   "shmtx forced unlock");

    if (ngx_atomic_cmp_set(mtx->lock, pid, 0)) {
        ngx_shmtx_wakeup(mtx);
        return 1;
    }

    return 0;
}